

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Geometry.cpp
# Opt level: O0

void __thiscall TRM::Vertex::insert_below(Vertex *this,Edge *e)

{
  bool bVar1;
  Edge *local_28;
  Edge *below_next;
  Edge *below_prev;
  Edge *e_local;
  Vertex *this_local;
  
  bVar1 = glm::operator==((vec<2,_float,_(glm::qualifier)0> *)(e->top + 0x48),
                          (vec<2,_float,_(glm::qualifier)0> *)(e->bottom + 0x48));
  if ((!bVar1) &&
     (bVar1 = VertexCompare::Compare((vec2 *)(e->bottom + 0x48),(vec2 *)(e->top + 0x48)), !bVar1)) {
    below_next = (Edge *)0x0;
    local_28 = *(Edge **)(this + 0x28);
    while ((local_28 != (Edge *)0x0 &&
           (bVar1 = Edge::is_right_of(local_28,(vec2 *)(e->bottom + 0x48)), !bVar1))) {
      below_next = local_28;
      local_28 = local_28->below_next;
    }
    LinkedList<TRM::Edge>::Insert<&TRM::Edge::below_prev,&TRM::Edge::below_next>
              (e,below_next,local_28,(Edge **)(this + 0x28),(Edge **)(this + 0x30));
  }
  return;
}

Assistant:

void Vertex::insert_below(Edge* e) {
  if (e->top->point == e->bottom->point ||                     // no edge
      VertexCompare::Compare(e->bottom->point, e->top->point)  // not below
  ) {
    return;
  }

  Edge* below_prev = nullptr;
  Edge* below_next = nullptr;

  for (below_next = edge_below.head; below_next != nullptr;
       below_next = below_next->below_next) {
    if (below_next->is_right_of(e->bottom->point)) {
      break;
    }

    below_prev = below_next;
  }

  LinkedList<Edge>::Insert<&Edge::below_prev, &Edge::below_next>(
      e, below_prev, below_next, &edge_below.head, &edge_below.tail);
}